

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_ibs.c
# Opt level: O0

err_t bignIdExtract(octet *id_privkey,octet *id_pubkey,bign_params *params,octet *oid_der,
                   size_t oid_len,octet *id_hash,octet *sig,octet *pubkey)

{
  ulong count;
  void *n_00;
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *ec_00;
  octet *hash;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  long in_R8;
  void *in_R9;
  void *in_stack_00000008;
  octet *in_stack_00000010;
  octet *stack;
  word *s1;
  word *s0;
  word *H;
  word *R;
  word *Q;
  ec_o *ec;
  void *state;
  size_t n;
  size_t no;
  err_t code;
  void *in_stack_ffffffffffffff48;
  void *src;
  bign_params *in_stack_ffffffffffffff50;
  word *state_00;
  size_t in_stack_ffffffffffffff58;
  word *a;
  octet *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  word *mod;
  word *a_00;
  bign_params *in_stack_ffffffffffffff80;
  word *a_01;
  void *in_stack_ffffffffffffff88;
  word *b;
  bign_deep_i in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  err_t local_44;
  err_t local_c;
  
  bVar1 = memIsValid(in_RDX,0x150);
  if (bVar1 == 0) {
    local_c = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(in_stack_ffffffffffffff50);
    if (bVar1 == 0) {
      local_c = 0x1f6;
    }
    else {
      if ((in_R8 != -1) &&
         (sVar4 = oidFromDER(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                             in_stack_ffffffffffffff58), sVar4 != 0xffffffffffffffff)) {
        bignStart_keep(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        ec_00 = (ec_o *)blobCreate((size_t)in_stack_ffffffffffffff48);
        if (ec_00 == (ec_o *)0x0) {
          return 0x6e;
        }
        eVar2 = bignStart(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        if (eVar2 != 0) {
          blobClose((blob_t)0x14c58b);
          return eVar2;
        }
        count = ec_00->f->no;
        n_00 = (void *)ec_00->f->n;
        bVar1 = memIsValid(in_R9,count);
        if ((((bVar1 == 0) ||
             (bVar1 = memIsValid(in_stack_00000008,count + (count >> 1)), bVar1 == 0)) ||
            (bVar1 = memIsValid(in_stack_00000010,count << 1), bVar1 == 0)) ||
           ((bVar1 = memIsValid(in_RDI,count), bVar1 == 0 ||
            (bVar1 = memIsValid(in_RSI,count << 1), bVar1 == 0)))) {
          blobClose((blob_t)0x14c654);
          return 0x6d;
        }
        state_00 = (word *)((long)&(ec_00->hdr).keep + (ec_00->hdr).keep);
        a = state_00 + (long)n_00 * 2;
        a_00 = a + (long)n_00;
        mod = a_00 + (long)n_00;
        a_01 = a;
        b = state_00;
        bVar1 = (*ec_00->f->from)(state_00,in_stack_00000010,ec_00->f,mod);
        if ((bVar1 == 0) ||
           (bVar1 = (*ec_00->f->from)(state_00 + (long)n_00,in_stack_00000010 + count,ec_00->f,mod),
           bVar1 == 0)) {
          blobClose((blob_t)0x14c73e);
          return 0x1f9;
        }
        u64From(&in_stack_ffffffffffffff50->l,in_stack_ffffffffffffff48,0x14c770);
        iVar3 = wwCmp(a_00,ec_00->order,(size_t)n_00);
        if (-1 < iVar3) {
          blobClose((blob_t)0x14c797);
          return 0x1fe;
        }
        u64From(&in_stack_ffffffffffffff50->l,in_stack_ffffffffffffff48,0x14c7bb);
        iVar3 = wwCmp(a_01,ec_00->order,(size_t)n_00);
        if (-1 < iVar3) {
          zzSub2(a_01,ec_00->order,(size_t)n_00);
        }
        zzAddMod(a_01,a,a_00,mod,(size_t)in_stack_ffffffffffffff60);
        u64From(&in_stack_ffffffffffffff50->l,in_stack_ffffffffffffff48,0x14c829);
        a[(ulong)n_00 >> 1] = 1;
        hash = (octet *)(((ulong)n_00 >> 1) + 1);
        src = n_00;
        bVar1 = ecAddMulA(b,ec_00,mod,2,ec_00->base,a_00);
        if (bVar1 == 0) {
          blobClose((blob_t)0x14c8a4);
          return 0x1fe;
        }
        (*ec_00->f->to)((octet *)b,b,ec_00->f,mod);
        beltHashStart(state_00);
        beltHashStepH(hash,(size_t)a,state_00);
        beltHashStepH(hash,(size_t)a,state_00);
        beltHashStepH(hash,(size_t)a,state_00);
        bVar1 = beltHashStepV2(hash,(size_t)a,state_00);
        if (bVar1 == 0) {
          local_44 = 0x1fe;
        }
        else {
          u64To(state_00,(size_t)src,(u64 *)0x14c95d);
          memCopy(state_00,src,0x14c974);
          (*ec_00->f->to)((octet *)((long)in_RSI + count),b + (long)n_00,ec_00->f,mod);
          local_44 = 0;
        }
        blobClose((blob_t)0x14c9c3);
        return local_44;
      }
      local_c = 0x12d;
    }
  }
  return local_c;
}

Assistant:

err_t bignIdExtract(octet id_privkey[], octet id_pubkey[], 
	const bign_params* params, const octet oid_der[], size_t oid_len,
	const octet id_hash[], const octet sig[], octet pubkey[])
{
	err_t code;
	size_t no, n;
	// состояние (буферы могут пересекаться)
	void* state;
	ec_o* ec;			/* описание эллиптической кривой */
	word* Q;			/* [2n] открытый ключ */
	word* R;			/* [2n] точка R */
	word* H;			/* [n] хэш-значение */
	word* s0;			/* [n / 2 + 1] первая часть подписи */
	word* s1;			/* [n] вторая часть подписи */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// проверить oid_der
	if (oid_len == SIZE_MAX || oidFromDER(0, oid_der, oid_len)  == SIZE_MAX)
		return ERR_BAD_OID;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignIdExtract_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	ASSERT(n % 2 == 0);
	// проверить входные указатели
	if (!memIsValid(id_hash, no) ||
		!memIsValid(sig, no + no / 2) ||
		!memIsValid(pubkey, 2 * no) ||
		!memIsValid(id_privkey, no) ||
		!memIsValid(id_pubkey, 2 * no))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	Q = R = objEnd(ec, word);
	H = s0 = Q + 2 * n;
	s1 = H + n;
	stack = (octet*)(s1 + n);
	// загрузить Q
	if (!qrFrom(ecX(Q), pubkey, ec->f, stack) ||
		!qrFrom(ecY(Q, n), pubkey + no, ec->f, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// загрузить и проверить s1
	wwFrom(s1, sig + no / 2, no);
	if (wwCmp(s1, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_SIG;
	}
	// s1 <- (s1 + H) mod q
	wwFrom(H, id_hash, no);
	if (wwCmp(H, ec->order, n) >= 0)
	{
		zzSub2(H, ec->order, n);
		// 2^{l - 1} < q < 2^l, H < 2^l => H - q < q
		ASSERT(wwCmp(H, ec->order, n) < 0);
	}
	zzAddMod(s1, s1, H, ec->order, n);
	// загрузить s0
	wwFrom(s0, sig, no);
	s0[n / 2] = 1;
	// R <- s1 G + (s0 + 2^l) Q
	if (!ecAddMulA(R, ec, stack, 2, ec->base, s1, n, Q, s0, n / 2 + 1))
	{
		blobClose(state);
		return ERR_BAD_SIG;
	}
	qrTo((octet*)R, ecX(R), ec->f, stack);
	// s0 == belt-hash(oid || R || H) mod 2^l?
	beltHashStart(stack);
	beltHashStepH(oid_der, oid_len, stack);
	beltHashStepH(R, no, stack);
	beltHashStepH(id_hash, no, stack);
	if (beltHashStepV2(sig, no / 2, stack))
	{
		wwTo(id_privkey, no, s1);
		memCopy(id_pubkey, R, no);
		qrTo(id_pubkey + no, ecY(R, n), ec->f, stack);
	}
	else
		code = ERR_BAD_SIG;
	// завершение
	blobClose(state);
	return code;
}